

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall QTreeWidgetItem::setExpanded(QTreeWidgetItem *this,bool expand)

{
  bool bVar1;
  QTreeView *this_00;
  QTreeModel *pQVar2;
  char *__s;
  long in_FS_OFFSET;
  QTreeWidgetItem *local_38;
  
  local_38 = *(QTreeWidgetItem **)(in_FS_OFFSET + 0x28);
  pQVar2 = treeModel(this,(QTreeWidget *)0x0);
  if (pQVar2 != (QTreeModel *)0x0) {
    bVar1 = pQVar2->skipPendingSort;
    pQVar2->skipPendingSort = true;
    this_00 = &this->view->super_QTreeView;
    __s = (char *)QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
    QTreeModel::index((QTreeModel *)&stack0xffffffffffffffb0,__s,(int)this);
    QTreeView::setExpanded(this_00,(QModelIndex *)&stack0xffffffffffffffb0,expand);
    pQVar2->skipPendingSort = bVar1;
  }
  if (*(QTreeWidgetItem **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetItem::setExpanded(bool expand)
{
    const QTreeModel *model = treeModel();
    if (!model)
        return;
    QTreeModel::SkipSorting skipSorting(model);
    view->setExpanded(view->d_func()->index(this), expand);
}